

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O3

void h264_print_slice_data(h264_slice *slice)

{
  uint32_t uVar1;
  uint32_t mbaddr;
  
  puts("Slice data:");
  uVar1 = slice->mbaff_frame_flag;
  mbaddr = (uVar1 + 1) * slice->first_mb_in_slice;
  while( true ) {
    if (uVar1 == 0) {
      printf("\tMacroblock %d (%d, %d):\n",(ulong)mbaddr,
             (ulong)mbaddr % (ulong)slice->pic_width_in_mbs,
             (ulong)mbaddr / (ulong)slice->pic_width_in_mbs);
    }
    else {
      printf("\tMacroblock %d (%d, %d, %d):\n",(ulong)mbaddr,
             (ulong)(uint)((int)mbaddr / 2) % (ulong)slice->pic_width_in_mbs,
             (ulong)(uint)((int)mbaddr / 2) / (ulong)slice->pic_width_in_mbs,
             (ulong)(uint)((int)mbaddr % 2));
    }
    h264_print_macroblock(slice,slice->mbs + (int)mbaddr);
    if (mbaddr == slice->last_mb_in_slice) break;
    mbaddr = h264_next_mb_addr(slice,mbaddr);
    uVar1 = slice->mbaff_frame_flag;
  }
  return;
}

Assistant:

void h264_print_slice_data(struct h264_slice *slice) {
	printf("Slice data:\n");
	int mb = slice->first_mb_in_slice * (1 + slice->mbaff_frame_flag);
	while (1) {
		if (slice->mbaff_frame_flag)
			printf("\tMacroblock %d (%d, %d, %d):\n", mb, mb/2 % slice->pic_width_in_mbs, mb/2 / slice->pic_width_in_mbs, mb%2);
		else
			printf("\tMacroblock %d (%d, %d):\n", mb, mb % slice->pic_width_in_mbs, mb / slice->pic_width_in_mbs);
		h264_print_macroblock(slice, &slice->mbs[mb]);
		if (mb == slice->last_mb_in_slice)
			break;
		mb = h264_next_mb_addr(slice, mb);
	}
}